

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

SourceLocation __thiscall
slang::SourceManager::createExpansionLoc
          (SourceManager *this,SourceLocation originalLoc,SourceRange expansionRange,bool isMacroArg
          )

{
  SourceLocation SVar1;
  unique_lock<std::shared_mutex> lock;
  unique_lock<std::shared_mutex> uStack_68;
  ExpansionInfo local_58;
  
  std::unique_lock<std::shared_mutex>::unique_lock(&uStack_68,&this->mutex);
  local_58.macroName._M_len = 0;
  local_58.macroName._M_str = (char *)0x0;
  local_58.originalLoc = originalLoc;
  local_58.expansionRange.startLoc = expansionRange.startLoc;
  local_58.expansionRange.endLoc = expansionRange.endLoc;
  local_58.isMacroArg = isMacroArg;
  std::
  vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
  ::emplace_back<slang::SourceManager::ExpansionInfo>(&this->bufferEntries,&local_58);
  SVar1._0_4_ = (int)((ulong)((long)(this->bufferEntries).
                                    super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->bufferEntries).
                                   super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 6) - 1U & 0xfffffff
  ;
  SVar1._4_4_ = 0;
  std::unique_lock<std::shared_mutex>::~unique_lock(&uStack_68);
  return SVar1;
}

Assistant:

SourceLocation SourceManager::createExpansionLoc(SourceLocation originalLoc,
                                                 SourceRange expansionRange, bool isMacroArg) {
    std::unique_lock<std::shared_mutex> lock(mutex);

    bufferEntries.emplace_back(ExpansionInfo(originalLoc, expansionRange, isMacroArg));
    return SourceLocation(BufferID((uint32_t)(bufferEntries.size() - 1), ""sv), 0);
}